

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingCXX.cxx
# Opt level: O0

string * adios2sys::Encoding::ToNarrow(wstring *str)

{
  ulong uVar1;
  ulong uVar2;
  int *piVar3;
  ulong in_RSI;
  string *in_RDI;
  size_t nullPos;
  size_t pos;
  string *nstr;
  string local_58 [48];
  long local_28;
  ulong local_20;
  undefined1 local_11;
  ulong local_10;
  string *wcstr;
  
  local_11 = 0;
  local_10 = in_RSI;
  wcstr = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  local_20 = 0;
  local_28 = 0;
  do {
    uVar1 = local_20;
    uVar2 = std::__cxx11::wstring::size();
    if ((uVar1 < uVar2) && (piVar3 = (int *)std::__cxx11::wstring::at(local_10), *piVar3 != 0)) {
      std::__cxx11::wstring::c_str();
      ToNarrow_abi_cxx11_((wchar_t *)wcstr);
      std::__cxx11::string::operator+=((string *)in_RDI,local_58);
      std::__cxx11::string::~string(local_58);
    }
    local_28 = std::__cxx11::wstring::find((wchar_t)local_10,0);
    if (local_28 != -1) {
      local_20 = local_28 + 1;
      std::__cxx11::string::operator+=((string *)in_RDI,'\0');
    }
  } while (local_28 != -1);
  return in_RDI;
}

Assistant:

std::string Encoding::ToNarrow(const std::wstring& str)
{
  std::string nstr;
#  if defined(_WIN32)
  int length =
    WideCharToMultiByte(KWSYS_ENCODING_DEFAULT_CODEPAGE, 0, str.c_str(),
                        int(str.size()), nullptr, 0, nullptr, nullptr);
  if (length > 0) {
    char* data = new char[length];
    int r =
      WideCharToMultiByte(KWSYS_ENCODING_DEFAULT_CODEPAGE, 0, str.c_str(),
                          int(str.size()), data, length, nullptr, nullptr);
    if (r > 0) {
      nstr = std::string(data, length);
    }
    delete[] data;
  }
#  else
  size_t pos = 0;
  size_t nullPos = 0;
  do {
    if (pos < str.size() && str.at(pos) != '\0') {
      nstr += ToNarrow(str.c_str() + pos);
    }
    nullPos = str.find(wchar_t('\0'), pos);
    if (nullPos != std::string::npos) {
      pos = nullPos + 1;
      nstr += '\0';
    }
  } while (nullPos != std::string::npos);
#  endif
  return nstr;
}